

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::OP_ApplyArgs
              (Var func,Var instance,void **stackPtr,CallInfo callInfo,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  RecyclableObject *this;
  ThreadContext *pTVar4;
  JavascriptMethod entryPoint_00;
  undefined4 *puVar5;
  Arguments local_130;
  undefined1 local_120 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  undefined1 local_108 [8];
  Arguments args;
  Var local_78;
  Var ret;
  JavascriptMethod entryPoint;
  RecyclableObject *funcPtr;
  int argCount;
  ScriptContext *scriptContext_local;
  void **stackPtr_local;
  Var instance_local;
  Var func_local;
  CallInfo callInfo_local;
  
  uVar3 = callInfo._0_4_ & 0xffffff;
  bVar2 = JavascriptConversion::IsCallable(func);
  if (!bVar2) {
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec76,(PCWSTR)0x0);
  }
  func_local._4_4_ = callInfo._4_4_;
  func_local._0_4_ = CONCAT13(2,callInfo._0_3_);
  this = UnsafeVarTo<Js::RecyclableObject>(func);
  pTVar4 = ScriptContext::GetThreadContext(scriptContext);
  ThreadContext::ProbeStack(pTVar4,(ulong)(uVar3 * 4 + 0xc00),scriptContext,(PVOID)0x0);
  entryPoint_00 = RecyclableObject::GetEntryPoint(this);
  switch(uVar3) {
  case 0:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0xde,"(false)","false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
    local_78 = (*entryPoint_00)(this,(CallInfo)this,func_local,0,0,0,0,func_local);
    break;
  case 1:
    local_78 = (*entryPoint_00)(this,(CallInfo)this,func_local,0,0,0,0,func_local,instance);
    break;
  case 2:
    local_78 = (*entryPoint_00)(this,(CallInfo)this,func_local,0,0,0,0,func_local,instance,*stackPtr
                               );
    break;
  case 3:
    local_78 = (*entryPoint_00)(this,(CallInfo)this,func_local,0,0,0,0,func_local,instance,*stackPtr
                                ,stackPtr[1]);
    break;
  case 4:
    local_78 = (*entryPoint_00)(this,(CallInfo)this,func_local,0,0,0,0,func_local,instance,*stackPtr
                                ,stackPtr[1],stackPtr[2]);
    break;
  case 5:
    local_78 = (*entryPoint_00)(this,(CallInfo)this,func_local,0,0,0,0,func_local,instance,*stackPtr
                                ,stackPtr[1],stackPtr[2],stackPtr[3]);
    break;
  case 6:
    local_78 = (*entryPoint_00)(this,(CallInfo)this,func_local,0,0,0,0,func_local,instance,*stackPtr
                                ,stackPtr[1],stackPtr[2],stackPtr[3],stackPtr[4]);
    break;
  case 7:
    args.Values = (Type)func_local;
    local_78 = (*entryPoint_00)(this,(CallInfo)this,func_local,0,0,0,0,func_local,instance,*stackPtr
                                ,stackPtr[1],stackPtr[2],stackPtr[3],stackPtr[4],stackPtr[5]);
    break;
  default:
    autoReentrancyHandler._8_8_ = func_local;
    Arguments::Arguments((Arguments *)local_108,(CallInfo)func_local,stackPtr + -1);
    pTVar4 = ScriptContext::GetThreadContext(scriptContext);
    AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_120,pTVar4);
    Arguments::Arguments(&local_130,(Arguments *)local_108);
    local_78 = JavascriptFunction::CallFunction<false>(this,entryPoint_00,&local_130,false);
    AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_120);
  }
  return local_78;
}

Assistant:

Var JavascriptOperators::OP_ApplyArgs(Var func, Var instance, __in_xcount(8) void** stackPtr, CallInfo callInfo, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_OP_ApplyArgs);
        int argCount = callInfo.Count;
        ///
        /// Check func has internal [[Call]] property
        /// If not, throw TypeError
        ///
        if (!JavascriptConversion::IsCallable(func)) {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedFunction);
        }

        // Fix callInfo: expect result/value, and none of other flags are currently applicable.
        //   OP_ApplyArgs expects a result. Neither of {jit, interpreted} mode sends correct callFlags:
        //   LdArgCnt -- jit sends whatever was passed to current function, interpreter always sends 0.
        //   See Win8 bug 490489.
        callInfo.Flags = CallFlags_Value;

        RecyclableObject *funcPtr = UnsafeVarTo<RecyclableObject>(func);
        PROBE_STACK(scriptContext, Js::Constants::MinStackDefault + argCount * 4);

        JavascriptMethod entryPoint = funcPtr->GetEntryPoint();
        Var ret;

        switch (argCount) {
        case 0:
            Assert(false);
            ret = CALL_ENTRYPOINT_NOASSERT(entryPoint, funcPtr, callInfo);
            break;
        case 1:
            ret = CALL_ENTRYPOINT_NOASSERT(entryPoint, funcPtr, callInfo, instance);
            break;
        case 2:
            ret = CALL_ENTRYPOINT_NOASSERT(entryPoint, funcPtr, callInfo, instance, stackPtr[0]);
            break;
        case 3:
            ret = CALL_ENTRYPOINT_NOASSERT(entryPoint, funcPtr, callInfo, instance, stackPtr[0], stackPtr[1]);
            break;
        case 4:
            ret = CALL_ENTRYPOINT_NOASSERT(entryPoint, funcPtr, callInfo, instance, stackPtr[0], stackPtr[1], stackPtr[2]);
            break;
        case 5:
            ret = CALL_ENTRYPOINT_NOASSERT(entryPoint, funcPtr, callInfo, instance, stackPtr[0], stackPtr[1], stackPtr[2], stackPtr[3]);
            break;
        case 6:
            ret = CALL_ENTRYPOINT_NOASSERT(entryPoint, funcPtr, callInfo, instance, stackPtr[0], stackPtr[1], stackPtr[2], stackPtr[3], stackPtr[4]);
            break;
        case 7:
            ret = CALL_ENTRYPOINT_NOASSERT(entryPoint, funcPtr, callInfo, instance, stackPtr[0], stackPtr[1], stackPtr[2], stackPtr[3], stackPtr[4], stackPtr[5]);
            break;
        default:
        {
            // Don't need stack probe here- we just did so above
            Arguments args(callInfo, stackPtr - 1);
            BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
            {
                ret = JavascriptFunction::CallFunction<false>(funcPtr, entryPoint, args);
            }
            END_SAFE_REENTRANT_CALL
            break;
        }
        }
        return ret;
        JIT_HELPER_END(Op_OP_ApplyArgs);
    }